

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::AddSettingsHandler(ImGuiSettingsHandler *handler)

{
  ImVector<ImGuiSettingsHandler>::push_back(&GImGui->SettingsHandlers,handler);
  return;
}

Assistant:

void ImGui::AddSettingsHandler(const ImGuiSettingsHandler* handler)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(FindSettingsHandler(handler->TypeName) == NULL);
    g.SettingsHandlers.push_back(*handler);
}